

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O3

int Abc_NtkIsAcyclic(Abc_Ntk_t *pNtk)

{
  ulong uVar1;
  FILE *__stream;
  int iVar2;
  int *piVar3;
  Vec_Ptr_t *pVVar4;
  char *pcVar5;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  Abc_Ntk_t *pAVar6;
  int iVar7;
  Abc_Obj_t *pNode;
  int iVar8;
  long lVar9;
  
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar2 = pNtk->vObjs->nSize;
    uVar1 = (long)iVar2 + 500;
    iVar8 = (int)uVar1;
    if ((pNtk->vTravIds).nCap < iVar8) {
      piVar3 = (int *)malloc(uVar1 * 4);
      (pNtk->vTravIds).pArray = piVar3;
      if (piVar3 == (int *)0x0) goto LAB_001c5eff;
      (pNtk->vTravIds).nCap = iVar8;
      in_RDX = extraout_RDX;
    }
    else {
      piVar3 = (int *)0x0;
    }
    if (-500 < iVar2) {
      memset(piVar3,0,(uVar1 & 0xffffffff) << 2);
      in_RDX = extraout_RDX_00;
    }
    (pNtk->vTravIds).nSize = iVar8;
    iVar2 = pNtk->nTravIds;
    pNtk->nTravIds = iVar2 + 1;
    if (0x3ffffffe < iVar2) goto LAB_001c5ee0;
    if (piVar3 == (int *)0x0) {
      iVar8 = pNtk->vObjs->nSize;
      uVar1 = (long)iVar8 + 500;
      iVar7 = (int)uVar1;
      if ((pNtk->vTravIds).nCap < iVar7) {
        piVar3 = (int *)malloc(uVar1 * 4);
        (pNtk->vTravIds).pArray = piVar3;
        if (piVar3 == (int *)0x0) {
LAB_001c5eff:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        (pNtk->vTravIds).nCap = iVar7;
        in_RDX = extraout_RDX_01;
      }
      else {
        piVar3 = (int *)0x0;
      }
      if (-500 < iVar8) {
        memset(piVar3,0,(uVar1 & 0xffffffff) << 2);
        in_RDX = extraout_RDX_02;
      }
      (pNtk->vTravIds).nSize = iVar7;
    }
  }
  else {
    iVar2 = pNtk->nTravIds;
    pNtk->nTravIds = iVar2 + 1;
    if (0x3ffffffe < iVar2) goto LAB_001c5ee0;
  }
  pNtk->nTravIds = iVar2 + 2;
  if (iVar2 != 0x3ffffffe) {
    pVVar4 = pNtk->vCos;
    if (0 < pVVar4->nSize) {
      lVar9 = 0;
      do {
        pNode = *(Abc_Obj_t **)
                 (*(long *)(*(long *)(*pVVar4->pArray[lVar9] + 0x20) + 8) +
                 (long)**(int **)((long)pVVar4->pArray[lVar9] + 0x20) * 8);
        pAVar6 = pNode->pNtk;
        if (pAVar6->ntkType == ABC_NTK_NETLIST) {
          pNode = (Abc_Obj_t *)pAVar6->vObjs->pArray[*(pNode->vFanins).pArray];
          pAVar6 = pNode->pNtk;
        }
        iVar2 = pNode->Id;
        Vec_IntFillExtra(&pAVar6->vTravIds,iVar2 + 1,(int)in_RDX);
        if (((long)iVar2 < 0) || ((pAVar6->vTravIds).nSize <= iVar2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        in_RDX = extraout_RDX_03;
        if (((pAVar6->vTravIds).pArray[iVar2] != pNode->pNtk->nTravIds + -1) &&
           (iVar2 = Abc_NtkIsAcyclic_rec(pNode), __stream = _stdout, in_RDX = extraout_RDX_04,
           iVar2 == 0)) {
          pcVar5 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
          fprintf(__stream," CO \"%s\"\n",pcVar5);
          return 0;
        }
        lVar9 = lVar9 + 1;
        pVVar4 = pNtk->vCos;
      } while (lVar9 < pVVar4->nSize);
    }
    return 1;
  }
LAB_001c5ee0:
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                ,0x197,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

int Abc_NtkIsAcyclic( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int fAcyclic;
    int i;
    // set the traversal ID for this DFS ordering
    Abc_NtkIncrementTravId( pNtk );   
    Abc_NtkIncrementTravId( pNtk );   
    // pNode->TravId == pNet->nTravIds      means "pNode is on the path"
    // pNode->TravId == pNet->nTravIds - 1  means "pNode is visited but is not on the path"
    // pNode->TravId <  pNet->nTravIds - 1  means "pNode is not visited"
    // traverse the network to detect cycles
    fAcyclic = 1;
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        pNode = Abc_ObjFanin0Ntk(Abc_ObjFanin0(pNode));
        if ( Abc_NodeIsTravIdPrevious(pNode) )
            continue;
        // traverse the output logic cone
        if ( (fAcyclic = Abc_NtkIsAcyclic_rec(pNode)) )
            continue;
        // stop as soon as the first loop is detected
        fprintf( stdout, " CO \"%s\"\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
        break;
    }
    return fAcyclic;
}